

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O2

double __thiscall jrtplib::RTPSourceData::INF_GetEstimatedTimestampUnit(RTPSourceData *this)

{
  double dVar1;
  RTPTime t2;
  RTPTime t1;
  RTPTime local_20;
  RTPTime local_18;
  
  if ((this->SRprevinf).hasinfo == true) {
    RTPTime::RTPTime(&local_18,(this->SRinf).ntptimestamp);
    RTPTime::RTPTime(&local_20,(this->SRprevinf).ntptimestamp);
    dVar1 = -1.0;
    if ((local_18.m_t != 0.0) || (NAN(local_18.m_t))) {
      if (((local_20.m_t != 0.0) || (NAN(local_20.m_t))) && (local_20.m_t < local_18.m_t)) {
        dVar1 = (local_18.m_t - local_20.m_t) /
                (double)((this->SRinf).rtptimestamp - (this->SRprevinf).rtptimestamp);
      }
    }
    return dVar1;
  }
  return -1.0;
}

Assistant:

double RTPSourceData::INF_GetEstimatedTimestampUnit() const
{
	if (!SRprevinf.HasInfo())
		return -1.0;
	
	RTPTime t1 = RTPTime(SRinf.GetNTPTimestamp());
	RTPTime t2 = RTPTime(SRprevinf.GetNTPTimestamp());
	if (t1.IsZero() || t2.IsZero()) // one of the times couldn't be calculated
		return -1.0;

	if (t1 <= t2)
		return -1.0;

	t1 -= t2; // get the time difference
	
	uint32_t tsdiff = SRinf.GetRTPTimestamp()-SRprevinf.GetRTPTimestamp();
	
	return (t1.GetDouble()/((double)tsdiff));
}